

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMpsFF.cpp
# Opt level: O0

Parsekey __thiscall
free_format_parser::HMpsFF::parseCols(HMpsFF *this,HighsLogOptions *log_options,istream *file)

{
  HMpsFF *pHVar1;
  int iVar2;
  HighsLogOptions *pHVar3;
  bool bVar4;
  __type _Var5;
  uint uVar6;
  reference pvVar7;
  reference pvVar8;
  string *psVar9;
  ulong uVar10;
  pointer ppVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  HighsLogOptions *in_RSI;
  size_type sVar14;
  long in_RDI;
  pair<int,_double> pVar15;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>,_bool>
  pVar16;
  double value_1;
  bool is_nan_1;
  iterator mit_3;
  double value;
  bool is_nan;
  iterator mit;
  iterator mit_2;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>,_bool>
  ret;
  HighsInt iRow_1;
  HighsInt iEl_1;
  string name;
  iterator mit_1;
  size_t end_marker;
  string marker;
  HighsInt iRow;
  HighsInt iEl;
  Parsekey key;
  size_t report_ignored_duplicate_matrix_nz_frequency;
  size_t num_ignored_duplicate_matrix_nz;
  size_t report_ignored_duplicate_cost_nz_frequency;
  size_t num_ignored_duplicate_cost_nz;
  size_t report_ignored_row_name_frequency;
  size_t num_ignored_row_name;
  bool skip;
  anon_class_16_2_6d4174b4 parseName;
  double col_cost;
  HighsInt col_count;
  vector<int,_std::allocator<int>_> col_index;
  vector<double,_std::allocator<double>_> col_value;
  bool integral_cols;
  size_t end;
  size_t start;
  HighsInt rowidx;
  string word;
  string strline;
  string colname;
  string *in_stack_fffffffffffffab8;
  undefined4 in_stack_fffffffffffffac0;
  int in_stack_fffffffffffffac4;
  HighsLogOptions *in_stack_fffffffffffffac8;
  istream *in_stack_fffffffffffffad0;
  HMpsFF *in_stack_fffffffffffffad8;
  HMpsFF *in_stack_fffffffffffffae0;
  undefined8 in_stack_fffffffffffffaf8;
  HMpsFF *in_stack_fffffffffffffb00;
  HighsLogOptions *in_stack_fffffffffffffb08;
  HMpsFF *in_stack_fffffffffffffb10;
  HighsLogOptions *in_stack_fffffffffffffb18;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  in_stack_fffffffffffffb20;
  size_t *in_stack_fffffffffffffb30;
  string *in_stack_fffffffffffffb38;
  string *in_stack_fffffffffffffbc8;
  size_t *in_stack_fffffffffffffbd0;
  size_t *in_stack_fffffffffffffbd8;
  undefined7 in_stack_fffffffffffffbe0;
  undefined1 in_stack_fffffffffffffbe7;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  in_stack_fffffffffffffbe8;
  bool local_399;
  string local_358 [32];
  HMpsFF *local_338;
  byte local_329;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  local_328;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  local_320;
  string local_318 [32];
  string local_2f8 [32];
  string local_2d8 [32];
  HMpsFF *local_2b8;
  byte local_2a9;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  local_2a8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  local_2a0;
  string local_298;
  undefined8 local_278;
  byte local_269;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  local_268;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  local_260;
  undefined1 local_258;
  int local_24c;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  local_248;
  byte local_240;
  int local_234;
  int local_21c;
  int local_218;
  int local_214;
  int local_210;
  double local_208;
  string local_200 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  local_1e0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  local_1d8;
  string local_1d0 [32];
  string *local_1b0;
  string local_1a8 [36];
  int local_184;
  int local_16c;
  int local_168;
  int local_164;
  int local_160;
  double local_158;
  Parsekey local_150;
  int local_14c;
  ulong local_148;
  ulong local_140;
  ulong local_138;
  ulong local_130;
  ulong local_128;
  ulong local_120;
  byte local_111;
  int *local_110;
  undefined8 local_100;
  HMpsFF *local_f8;
  int local_ec;
  vector<int,_std::allocator<int>_> local_e8;
  vector<double,_std::allocator<double>_> local_d0;
  byte local_b1;
  size_t *local_b0;
  int local_9c;
  string local_98 [32];
  string local_78 [55];
  allocator local_41;
  string local_40 [40];
  HighsLogOptions *local_18;
  Parsekey local_4;
  
  local_18 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"",&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  std::__cxx11::string::string(local_78);
  std::__cxx11::string::string(local_98);
  local_b1 = 0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x45e9c6);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x45e9d3);
  local_ec = 0;
  local_f8 = (HMpsFF *)0x0;
  local_100 = 0;
  std::vector<double,_std::allocator<double>_>::assign
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
             (size_type)in_stack_fffffffffffffab8,(value_type_conflict1 *)0x45ea17);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffae0,
             (size_type)in_stack_fffffffffffffad8);
  local_110 = &local_9c;
  local_120 = 0;
  local_128 = 1;
  local_130 = 0;
  local_138 = 1;
  local_140 = 0;
  local_148 = 1;
LAB_0045ea9c:
  do {
    bVar4 = getMpsLine(in_stack_fffffffffffffad8,in_stack_fffffffffffffad0,
                       (string *)in_stack_fffffffffffffac8,
                       (bool *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0));
    if (!bVar4) {
      local_4 = kFail;
      local_14c = 1;
      goto LAB_004601fe;
    }
  } while ((local_111 & 1) != 0);
  bVar4 = timeout((HMpsFF *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0));
  if (bVar4) {
    local_4 = kTimeout;
    local_14c = 1;
    goto LAB_004601fe;
  }
  local_150 = checkFirstWord((HMpsFF *)in_stack_fffffffffffffbe8._M_cur,
                             (string *)CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0)
                             ,in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0,
                             in_stack_fffffffffffffbc8);
  if (local_150 == kNone) {
    first_word(in_stack_fffffffffffffb38,(size_t)in_stack_fffffffffffffb30);
    local_1b0 = (string *)
                first_word_end((string *)in_stack_fffffffffffffb18,(size_t)in_stack_fffffffffffffb10
                              );
    bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
                            (char *)in_stack_fffffffffffffab8);
    if (bVar4) {
      first_word(in_stack_fffffffffffffb38,(size_t)in_stack_fffffffffffffb30);
      std::__cxx11::string::operator=(local_1a8,local_1d0);
      std::__cxx11::string::~string(local_1d0);
      if ((((local_b1 & 1) != 0) &&
          (bVar4 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
                                   (char *)in_stack_fffffffffffffab8), bVar4)) ||
         (((local_b1 & 1) == 0 &&
          (bVar4 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
                                   (char *)in_stack_fffffffffffffab8), bVar4)))) {
        highsLogUser(local_18,kError,"Integrality marker error in COLUMNS section of MPS file\n");
        local_4 = kFail;
        local_14c = 1;
      }
      else {
        local_b1 = (local_b1 ^ 0xff) & 1;
        local_14c = 2;
      }
    }
    else {
      if (local_1b0 < (undefined1 *)0x9) {
        local_1d8._M_cur =
             (__node_type *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     *)in_stack_fffffffffffffab8,(key_type *)0x45efea);
        local_1e0._M_cur =
             (__node_type *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    *)in_stack_fffffffffffffab8);
        bVar4 = std::__detail::operator==(&local_1d8,&local_1e0);
        if (bVar4) {
          std::__cxx11::string::substr((ulong)local_200,(ulong)local_78);
          psVar9 = trim((string *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
                        in_stack_fffffffffffffab8);
          std::__cxx11::string::operator=(local_200,(string *)psVar9);
          uVar10 = std::__cxx11::string::size();
          pHVar3 = local_18;
          if (uVar10 < 9) {
            *(undefined1 *)(in_RDI + 8) = 1;
            uVar12 = std::__cxx11::string::c_str();
            uVar6 = std::__cxx11::string::size();
            highsLogUser(pHVar3,kWarning,
                         "Row name \"%s\" with spaces has length %d, so assume fixed format\n",
                         uVar12,(ulong)uVar6);
            local_4 = kFixedFormat;
          }
          else {
            uVar12 = std::__cxx11::string::c_str();
            highsLogUser(pHVar3,kError,
                         "Row name \"%s\" with spaces exceeds fixed format name length of 8\n",
                         uVar12);
            local_4 = kFail;
          }
          local_14c = 1;
          std::__cxx11::string::~string(local_200);
          goto LAB_004601a7;
        }
      }
      _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffae0,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffad8);
      if (!_Var5) {
        if (*(int *)(in_RDI + 0x1c) != 0) {
          if (((double)local_f8 != 0.0) || (NAN((double)local_f8))) {
            local_214 = *(int *)(in_RDI + 0x1c) + -1;
            pVar15 = std::make_pair<int,double&>
                               ((int *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0)
                                ,(double *)in_stack_fffffffffffffab8);
            local_208 = pVar15.second;
            local_210 = pVar15.first;
            std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::push_back
                      ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                       CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
                       (value_type *)in_stack_fffffffffffffab8);
            local_f8 = (HMpsFF *)0x0;
          }
          for (local_218 = 0; local_218 < local_ec; local_218 = local_218 + 1) {
            pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&local_e8,(long)local_218);
            local_21c = *pvVar7;
            local_234 = *(int *)(in_RDI + 0x1c) + -1;
            std::vector<double,_std::allocator<double>_>::operator[](&local_d0,(long)local_21c);
            std::make_tuple<int,int_const&,double&>
                      ((int *)in_stack_fffffffffffffac8,
                       (int *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
                       (double *)in_stack_fffffffffffffab8);
            std::
            vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>::
            push_back((vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                       *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
                      (value_type *)in_stack_fffffffffffffab8);
            pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                               (&local_d0,(long)local_21c);
            *pvVar8 = 0.0;
          }
          local_ec = 0;
        }
        std::__cxx11::string::operator=(local_40,local_98);
        local_24c = *(int *)(in_RDI + 0x1c);
        *(int *)(in_RDI + 0x1c) = local_24c + 1;
        pVar16 = std::
                 unordered_map<std::__cxx11::string,int,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                 ::emplace<std::__cxx11::string&,int>
                           ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                             *)in_stack_fffffffffffffad0,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffac8,
                            (int *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0));
        local_260._M_cur =
             (__node_type *)
             pVar16.first.
             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
             ._M_cur;
        local_258 = pVar16.second;
        local_248._M_cur = local_260._M_cur;
        local_240 = local_258;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffad0,(value_type *)in_stack_fffffffffffffac8);
        if (((local_240 & 1) == 0) && ((*(byte *)(in_RDI + 0x1dd) & 1) == 0)) {
          *(undefined1 *)(in_RDI + 0x1dd) = 1;
          in_stack_fffffffffffffbe8._M_cur =
               (__node_type *)
               std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                       *)in_stack_fffffffffffffab8,(key_type *)0x45f485);
          local_268._M_cur = in_stack_fffffffffffffbe8._M_cur;
          std::__cxx11::string::operator=((string *)(in_RDI + 0x208),local_40);
          ppVar11 = std::__detail::
                    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>
                    ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>
                                  *)0x45f4ca);
          *(int *)(in_RDI + 0x228) = ppVar11->second;
          *(int *)(in_RDI + 0x22c) = *(int *)(in_RDI + 0x1c) + -1;
        }
        local_269 = local_b1 & 1;
        std::vector<HighsVarType,_std::allocator<HighsVarType>_>::push_back
                  ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)
                   CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
                   (value_type *)in_stack_fffffffffffffab8);
        in_stack_fffffffffffffbd8 = (size_t *)(in_RDI + 0x1b0);
        in_stack_fffffffffffffbe7 = 0;
        if ((local_b1 & 1) != 0) {
          in_stack_fffffffffffffbe7 = *(undefined1 *)(in_RDI + 0x260);
        }
        std::vector<bool,_std::allocator<bool>_>::push_back
                  ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffb20._M_cur,
                   SUB81((ulong)in_stack_fffffffffffffb18 >> 0x38,0));
        local_278 = 0;
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)
                   CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
                   (value_type_conflict1 *)in_stack_fffffffffffffab8);
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffad0,
                   (value_type_conflict1 *)in_stack_fffffffffffffac8);
      }
      std::__cxx11::string::operator=(local_98,"");
      first_word(in_stack_fffffffffffffb38,(size_t)in_stack_fffffffffffffb30);
      in_stack_fffffffffffffbc8 = &local_298;
      std::__cxx11::string::operator=(local_98,(string *)in_stack_fffffffffffffbc8);
      std::__cxx11::string::~string((string *)in_stack_fffffffffffffbc8);
      in_stack_fffffffffffffbd0 =
           (size_t *)
           first_word_end((string *)in_stack_fffffffffffffb18,(size_t)in_stack_fffffffffffffb10);
      local_b0 = in_stack_fffffffffffffbd0;
      bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
                              (char *)in_stack_fffffffffffffab8);
      if (bVar4) {
        trim((string *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
             in_stack_fffffffffffffab8);
        pHVar3 = local_18;
        uVar12 = std::__cxx11::string::c_str();
        highsLogUser(pHVar3,kError,"No coefficient given for column \"%s\"\n",uVar12);
        local_4 = kFail;
        local_14c = 1;
      }
      else {
        local_2a0._M_cur =
             (__node_type *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     *)in_stack_fffffffffffffab8,(key_type *)0x45f6ff);
        local_2a8._M_cur =
             (__node_type *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    *)in_stack_fffffffffffffab8);
        bVar4 = std::__detail::operator==(&local_2a0,&local_2a8);
        pHVar3 = local_18;
        if (bVar4) {
          local_120 = local_120 + 1;
          if (local_120 % local_128 == 0) {
            std::__cxx11::string::c_str();
            highsLogUser(pHVar3,kWarning,
                         "Row name \"%s\" in COLUMNS section is not defined: ignored\n");
            local_128 = local_128 << 1;
          }
        }
        else {
          local_2a9 = 0;
          local_2b8 = (HMpsFF *)
                      getValue(in_stack_fffffffffffffb10,(string *)in_stack_fffffffffffffb08,
                               (bool *)in_stack_fffffffffffffb00,
                               (HighsInt)((ulong)in_stack_fffffffffffffaf8 >> 0x20));
          pHVar3 = local_18;
          if ((local_2a9 & 1) != 0) {
            uVar12 = std::__cxx11::string::c_str();
            highsLogUser(pHVar3,kError,"Coefficient for column \"%s\" is NaN\n",uVar12);
            local_4 = kFail;
            local_14c = 1;
            goto LAB_004601a7;
          }
          if (((double)local_2b8 != 0.0) || (NAN((double)local_2b8))) {
            std::__cxx11::string::string(local_2d8,local_1a8);
            parseCols::anon_class_16_2_6d4174b4::operator()
                      ((anon_class_16_2_6d4174b4 *)in_stack_fffffffffffffad0,
                       (string *)in_stack_fffffffffffffac8);
            std::__cxx11::string::~string(local_2d8);
            pHVar3 = local_18;
            if (local_9c < 0) {
              if (local_9c == -1) {
                if (((double)local_f8 != 0.0) || (NAN((double)local_f8))) {
                  local_130 = local_130 + 1;
                  if (local_130 % local_138 == 0) {
                    uVar12 = std::__cxx11::string::c_str();
                    pHVar1 = local_2b8;
                    uVar13 = std::__cxx11::string::c_str();
                    highsLogUser((HighsLogOptions *)pHVar1,(HighsLogType)pHVar3,(char *)0x4,
                                 "Column \"%s\" has duplicate nonzero %g in objective row \"%s\": ignored\n"
                                 ,uVar12,uVar13);
                    local_138 = local_138 << 1;
                  }
                }
                else {
                  local_f8 = local_2b8;
                }
              }
            }
            else {
              pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (&local_d0,(long)local_9c);
              pHVar3 = local_18;
              pHVar1 = local_2b8;
              if ((*pvVar8 != 0.0) || (NAN(*pvVar8))) {
                *(int *)(in_RDI + 0x20) = *(int *)(in_RDI + 0x20) + -1;
                local_140 = local_140 + 1;
                if (local_140 % local_148 == 0) {
                  uVar12 = std::__cxx11::string::c_str();
                  pHVar1 = local_2b8;
                  uVar13 = std::__cxx11::string::c_str();
                  highsLogUser((HighsLogOptions *)pHVar1,(HighsLogType)pHVar3,(char *)0x4,
                               "Column \"%s\" has duplicate nonzero %g in row \"%s\": ignored\n",
                               uVar12,uVar13);
                  local_148 = local_148 << 1;
                }
              }
              else {
                pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                                   (&local_d0,(long)local_9c);
                iVar2 = local_9c;
                *pvVar8 = (value_type)pHVar1;
                sVar14 = (size_type)local_ec;
                local_ec = local_ec + 1;
                pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&local_e8,sVar14);
                *pvVar7 = iVar2;
              }
            }
          }
        }
        bVar4 = is_end((string *)in_stack_fffffffffffffad8,(size_t)in_stack_fffffffffffffad0,
                       (string *)in_stack_fffffffffffffac8);
        if (bVar4) {
LAB_0046019c:
          local_14c = 0;
        }
        else {
          first_word(in_stack_fffffffffffffb38,(size_t)in_stack_fffffffffffffb30);
          std::__cxx11::string::operator=(local_1a8,local_2f8);
          std::__cxx11::string::~string(local_2f8);
          bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
                                  (char *)in_stack_fffffffffffffab8);
          if (bVar4) {
            trim((string *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
                 in_stack_fffffffffffffab8);
            pHVar3 = local_18;
            uVar12 = std::__cxx11::string::c_str();
            highsLogUser(pHVar3,kError,"No coefficient given for column \"%s\"\n",uVar12);
            local_4 = kFail;
            local_14c = 1;
          }
          else {
            in_stack_fffffffffffffb38 =
                 (string *)
                 first_word_end((string *)in_stack_fffffffffffffb18,
                                (size_t)in_stack_fffffffffffffb10);
            local_1b0 = in_stack_fffffffffffffb38;
            std::__cxx11::string::operator=(local_98,"");
            local_1b0 = (string *)&local_1b0->field_0x1;
            first_word(in_stack_fffffffffffffb38,(size_t)in_stack_fffffffffffffb30);
            std::__cxx11::string::operator=(local_98,local_318);
            std::__cxx11::string::~string(local_318);
            in_stack_fffffffffffffb30 =
                 (size_t *)
                 first_word_end((string *)in_stack_fffffffffffffb18,
                                (size_t)in_stack_fffffffffffffb10);
            local_b0 = in_stack_fffffffffffffb30;
            in_stack_fffffffffffffb20._M_cur =
                 (__node_type *)
                 std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                         *)in_stack_fffffffffffffab8,(key_type *)0x45fd66);
            local_320._M_cur = in_stack_fffffffffffffb20._M_cur;
            local_328._M_cur =
                 (__node_type *)
                 std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                        *)in_stack_fffffffffffffab8);
            bVar4 = std::__detail::operator==(&local_320,&local_328);
            if (bVar4) {
              local_120 = local_120 + 1;
              if (local_120 % local_128 == 0) {
                in_stack_fffffffffffffb18 = local_18;
                uVar12 = std::__cxx11::string::c_str();
                highsLogUser(in_stack_fffffffffffffb18,kWarning,
                             "Row name \"%s\" in COLUMNS section is not defined: ignored\n",uVar12);
                local_128 = local_128 << 1;
              }
              local_14c = 2;
            }
            else {
              local_329 = 0;
              in_stack_fffffffffffffb10 =
                   (HMpsFF *)
                   getValue(in_stack_fffffffffffffb10,(string *)in_stack_fffffffffffffb08,
                            (bool *)in_stack_fffffffffffffb00,
                            (HighsInt)((ulong)in_stack_fffffffffffffaf8 >> 0x20));
              local_338 = in_stack_fffffffffffffb10;
              if ((local_329 & 1) == 0) {
                if (((double)in_stack_fffffffffffffb10 != 0.0) ||
                   (NAN((double)in_stack_fffffffffffffb10))) {
                  std::__cxx11::string::string(local_358,local_1a8);
                  parseCols::anon_class_16_2_6d4174b4::operator()
                            ((anon_class_16_2_6d4174b4 *)in_stack_fffffffffffffad0,
                             (string *)in_stack_fffffffffffffac8);
                  std::__cxx11::string::~string(local_358);
                  if (local_9c < 0) {
                    if (local_9c == -1) {
                      if (((double)local_f8 != 0.0) || (NAN((double)local_f8))) {
                        local_130 = local_130 + 1;
                        if (local_130 % local_138 == 0) {
                          in_stack_fffffffffffffac8 = local_18;
                          in_stack_fffffffffffffad0 = (istream *)std::__cxx11::string::c_str();
                          in_stack_fffffffffffffad8 = local_338;
                          uVar12 = std::__cxx11::string::c_str();
                          highsLogUser((HighsLogOptions *)in_stack_fffffffffffffad8,
                                       (HighsLogType)in_stack_fffffffffffffac8,(char *)0x4,
                                       "Column \"%s\" has duplicate nonzero %g in objective row \"%s\": ignored\n"
                                       ,in_stack_fffffffffffffad0,uVar12);
                          local_138 = local_138 << 1;
                        }
                      }
                      else {
                        local_f8 = local_338;
                      }
                    }
                  }
                  else {
                    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                                       (&local_d0,(long)local_9c);
                    pHVar3 = local_18;
                    if ((*pvVar8 != 0.0) || (NAN(*pvVar8))) {
                      *(int *)(in_RDI + 0x20) = *(int *)(in_RDI + 0x20) + -1;
                      local_140 = local_140 + 1;
                      if (local_140 % local_148 == 0) {
                        in_stack_fffffffffffffaf8 = std::__cxx11::string::c_str();
                        in_stack_fffffffffffffb00 = local_338;
                        uVar12 = std::__cxx11::string::c_str();
                        highsLogUser((HighsLogOptions *)in_stack_fffffffffffffb00,
                                     (HighsLogType)pHVar3,(char *)0x4,
                                     "Column \"%s\" has duplicate nonzero %g in row \"%s\": ignored\n"
                                     ,in_stack_fffffffffffffaf8,uVar12);
                        local_148 = local_148 << 1;
                      }
                    }
                    else {
                      in_stack_fffffffffffffae0 = local_338;
                      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                                         (&local_d0,(long)local_9c);
                      iVar2 = local_9c;
                      *pvVar8 = (value_type)in_stack_fffffffffffffae0;
                      sVar14 = (size_type)local_ec;
                      local_ec = local_ec + 1;
                      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&local_e8,sVar14);
                      *pvVar7 = iVar2;
                    }
                  }
                }
                goto LAB_0046019c;
              }
              in_stack_fffffffffffffb08 = local_18;
              uVar12 = std::__cxx11::string::c_str();
              highsLogUser(in_stack_fffffffffffffb08,kError,"Coefficient for column \"%s\" is NaN\n"
                           ,uVar12);
              local_4 = kFail;
              local_14c = 1;
            }
          }
        }
      }
    }
LAB_004601a7:
    std::__cxx11::string::~string(local_1a8);
    in_stack_fffffffffffffac4 = local_14c;
    if ((local_14c == 0) || (local_14c == 2)) goto LAB_0045ea9c;
  }
  else {
    if (*(int *)(in_RDI + 0x1c) != 0) {
      if (((double)local_f8 != 0.0) || (NAN((double)local_f8))) {
        local_164 = *(int *)(in_RDI + 0x1c) + -1;
        pVar15 = std::make_pair<int,double&>
                           ((int *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
                            (double *)in_stack_fffffffffffffab8);
        local_158 = pVar15.second;
        local_160 = pVar15.first;
        std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::push_back
                  ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                   CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
                   (value_type *)in_stack_fffffffffffffab8);
        local_f8 = (HMpsFF *)0x0;
      }
      for (local_168 = 0; local_168 < local_ec; local_168 = local_168 + 1) {
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&local_e8,(long)local_168);
        local_16c = *pvVar7;
        local_184 = *(int *)(in_RDI + 0x1c) + -1;
        std::vector<double,_std::allocator<double>_>::operator[](&local_d0,(long)local_16c);
        std::make_tuple<int,int_const&,double&>
                  ((int *)in_stack_fffffffffffffac8,
                   (int *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
                   (double *)in_stack_fffffffffffffab8);
        std::vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>::
        push_back((vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                   *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
                  (value_type *)in_stack_fffffffffffffab8);
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](&local_d0,(long)local_16c)
        ;
        *pvVar8 = 0.0;
      }
      local_ec = 0;
    }
    local_399 = true;
    if ((local_120 == 0) && (local_399 = true, local_130 == 0)) {
      local_399 = local_140 != 0;
    }
    *(bool *)(in_RDI + 8) = local_399;
    if ((*(byte *)(in_RDI + 8) & 1) != 0) {
      highsLogUser(local_18,kWarning,
                   "COLUMNS section: ignored %d undefined rows %d duplicate cost values and %d duplicate matrix values\n"
                   ,local_120 & 0xffffffff,local_130 & 0xffffffff,local_140 & 0xffffffff);
    }
    highsLogDev(local_18,kInfo,"readMPS: Read COLUMNS OK\n");
    local_4 = local_150;
    local_14c = 1;
  }
LAB_004601fe:
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffad0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffad0);
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_40);
  return local_4;
}

Assistant:

typename HMpsFF::Parsekey HMpsFF::parseCols(const HighsLogOptions& log_options,
                                            std::istream& file) {
  std::string colname = "";
  std::string strline, word;
  HighsInt rowidx;
  size_t start, end;
  bool integral_cols = false;
  assert(num_col == 0);
  // Define the scattered value vector, index vector and count
  std::vector<double> col_value;
  std::vector<HighsInt> col_index;
  HighsInt col_count = 0;
  double col_cost = 0;
  col_value.assign(num_row, 0);
  col_index.resize(num_row);

  auto parseName = [&rowidx, this](std::string name) {
    auto mit = rowname2idx.find(name);

    assert(mit != rowname2idx.end());
    rowidx = mit->second;

    if (rowidx >= 0)
      this->num_nz++;
    else
      assert(-1 == rowidx || -2 == rowidx);
  };

  bool skip;
  size_t num_ignored_row_name = 0;
  size_t report_ignored_row_name_frequency = 1;
  size_t num_ignored_duplicate_cost_nz = 0;
  size_t report_ignored_duplicate_cost_nz_frequency = 1;
  size_t num_ignored_duplicate_matrix_nz = 0;
  size_t report_ignored_duplicate_matrix_nz_frequency = 1;
  while (getMpsLine(file, strline, skip)) {
    if (skip) continue;
    if (timeout()) return HMpsFF::Parsekey::kTimeout;

    HMpsFF::Parsekey key = checkFirstWord(strline, start, end, word);

    // start of new section?
    if (key != Parsekey::kNone) {
      if (num_col) {
        if (col_cost) {
          coeffobj.push_back(std::make_pair(num_col - 1, col_cost));
          col_cost = 0;
        }
        for (HighsInt iEl = 0; iEl < col_count; iEl++) {
          const HighsInt iRow = col_index[iEl];
          assert(col_value[iRow]);
          entries.push_back(
              std::make_tuple(num_col - 1, iRow, col_value[iRow]));
          col_value[iRow] = 0;
        }
        col_count = 0;
      }

      warning_issued_ = num_ignored_row_name > 0 ||
                        num_ignored_duplicate_cost_nz > 0 ||
                        num_ignored_duplicate_matrix_nz > 0;
      if (warning_issued_)
        highsLogUser(log_options, HighsLogType::kWarning,
                     "COLUMNS section: ignored %d undefined rows %d duplicate "
                     "cost values and %d duplicate matrix values\n",
                     int(num_ignored_row_name),
                     int(num_ignored_duplicate_cost_nz),
                     int(num_ignored_duplicate_matrix_nz));
      highsLogDev(log_options, HighsLogType::kInfo,
                  "readMPS: Read COLUMNS OK\n");
      return key;
    }

    // check for integrality marker
    std::string marker = first_word(strline, end);
    size_t end_marker = first_word_end(strline, end);

    if (marker == "'MARKER'") {
      marker = first_word(strline, end_marker);

      if ((integral_cols && marker != "'INTEND'") ||
          (!integral_cols && marker != "'INTORG'")) {
        highsLogUser(
            log_options, HighsLogType::kError,
            "Integrality marker error in COLUMNS section of MPS file\n");
        return Parsekey::kFail;
      }
      integral_cols = !integral_cols;

      continue;
    }
    // Detect whether the file is in fixed format with spaces in
    // names, even if there are no known examples!
    //
    // end_marker should be the end index of the row name:
    //
    // If the names are at least 8 characters, end_marker should be
    // more than 13 minus the 4 whitespaces we have trimmed from the
    // start so more than 9
    //
    // However, free format MPS can have names with only one character
    // (pyomo.mps). Have to distinguish this from 8-character names
    // with spaces. Best bet is to see whether "marker" is in the set
    // of row names. If it is, then assume that the names are short
    if (end_marker < 9) {
      auto mit = rowname2idx.find(marker);
      if (mit == rowname2idx.end()) {
        // marker is not a row name, so continue to look at name
        std::string name = strline.substr(0, 10);
        // Delete trailing spaces
        name = trim(name);
        if (name.size() > 8) {
          highsLogUser(log_options, HighsLogType::kError,
                       "Row name \"%s\" with spaces exceeds fixed format name "
                       "length of 8\n",
                       name.c_str());
          return HMpsFF::Parsekey::kFail;
        } else {
          warning_issued_ = true;
          highsLogUser(log_options, HighsLogType::kWarning,
                       "Row name \"%s\" with spaces has length %d, so assume "
                       "fixed format\n",
                       name.c_str(), (int)name.size());
          return HMpsFF::Parsekey::kFixedFormat;
        }
      }
    }

    // Test for new column
    if (!(word == colname)) {
      // Record the nonzeros in any previous column
      if (num_col) {
        if (col_cost) {
          coeffobj.push_back(std::make_pair(num_col - 1, col_cost));
          col_cost = 0;
        }
        for (HighsInt iEl = 0; iEl < col_count; iEl++) {
          const HighsInt iRow = col_index[iEl];
          assert(col_value[iRow]);
          entries.push_back(
              std::make_tuple(num_col - 1, iRow, col_value[iRow]));
          col_value[iRow] = 0;
        }
        col_count = 0;
      }
      assert(!col_cost);
      colname = word;
      auto ret = colname2idx.emplace(colname, num_col++);
      col_names.push_back(colname);
      if (!ret.second) {
        // Duplicate col name
        if (!has_duplicate_col_name_) {
          // This is the first so record it
          has_duplicate_col_name_ = true;
          auto mit = colname2idx.find(colname);
          assert(mit != colname2idx.end());
          duplicate_col_name_ = colname;
          duplicate_col_name_index0_ = mit->second;
          duplicate_col_name_index1_ = num_col - 1;
        }
      }

      // Mark the column as integer, according to whether
      // the integral_cols flag is set
      col_integrality.push_back(integral_cols ? HighsVarType::kInteger
                                              : HighsVarType::kContinuous);
      // Mark the column as binary as well
      col_binary.push_back(integral_cols && kintegerVarsInColumnsAreBinary);

      // initialize with default bounds
      col_lower.push_back(0.0);
      col_upper.push_back(kHighsInf);
    }

    assert(num_col > 0);

    // here marker is the row name and end marks its end
    word = "";
    word = first_word(strline, end_marker);
    end = first_word_end(strline, end_marker);

    if (word == "") {
      trim(marker);
      highsLogUser(log_options, HighsLogType::kError,
                   "No coefficient given for column \"%s\"\n", marker.c_str());
      return HMpsFF::Parsekey::kFail;
    }

    auto mit = rowname2idx.find(marker);
    if (mit == rowname2idx.end()) {
      num_ignored_row_name++;
      if (num_ignored_row_name % report_ignored_row_name_frequency == 0) {
        highsLogUser(
            log_options, HighsLogType::kWarning,
            "Row name \"%s\" in COLUMNS section is not defined: ignored\n",
            marker.c_str());
        report_ignored_row_name_frequency *= 2;
      }
    } else {
      bool is_nan = false;
      double value = getValue(word, is_nan);  // atof(word.c_str());
      if (is_nan) {
        highsLogUser(log_options, HighsLogType::kError,
                     "Coefficient for column \"%s\" is NaN\n", marker.c_str());
        return HMpsFF::Parsekey::kFail;
      }
      if (value) {
        parseName(marker);  // rowidx set and num_nz incremented
        if (rowidx >= 0) {
          if (col_value[rowidx]) {
            // Ignore duplicate entry
            num_nz--;
            num_ignored_duplicate_matrix_nz++;
            if (num_ignored_duplicate_matrix_nz %
                    report_ignored_duplicate_matrix_nz_frequency ==
                0) {
              highsLogUser(log_options, HighsLogType::kWarning,
                           "Column \"%s\" has duplicate nonzero %g in row "
                           "\"%s\": ignored\n",
                           colname.c_str(), value, marker.c_str());
              report_ignored_duplicate_matrix_nz_frequency *= 2;
            }
          } else {
            col_value[rowidx] = value;
            col_index[col_count++] = rowidx;
          }
        } else if (rowidx == -1) {
          // Ignore duplicate entry
          if (col_cost) {
            num_ignored_duplicate_cost_nz++;
            if (num_ignored_duplicate_cost_nz %
                    report_ignored_duplicate_cost_nz_frequency ==
                0) {
              highsLogUser(log_options, HighsLogType::kWarning,
                           "Column \"%s\" has duplicate nonzero %g in "
                           "objective row \"%s\": ignored\n",
                           colname.c_str(), value, marker.c_str());
              report_ignored_duplicate_cost_nz_frequency *= 2;
            }
          } else {
            col_cost = value;
          }
        }
      }
    }

    if (!is_end(strline, end)) {
      // parse second coefficient
      marker = first_word(strline, end);
      if (word == "") {
        trim(marker);
        highsLogUser(log_options, HighsLogType::kError,
                     "No coefficient given for column \"%s\"\n",
                     marker.c_str());
        return HMpsFF::Parsekey::kFail;
      }
      end_marker = first_word_end(strline, end);

      // here marker is the row name and end marks its end
      word = "";
      end_marker++;
      word = first_word(strline, end_marker);
      end = first_word_end(strline, end_marker);

      assert(is_end(strline, end));

      auto mit = rowname2idx.find(marker);
      if (mit == rowname2idx.end()) {
        num_ignored_row_name++;
        if (num_ignored_row_name % report_ignored_row_name_frequency == 0) {
          highsLogUser(
              log_options, HighsLogType::kWarning,
              "Row name \"%s\" in COLUMNS section is not defined: ignored\n",
              marker.c_str());
          report_ignored_row_name_frequency *= 2;
        }
        continue;
      };
      bool is_nan = false;
      double value = getValue(word, is_nan);  // atof(word.c_str());
      if (is_nan) {
        highsLogUser(log_options, HighsLogType::kError,
                     "Coefficient for column \"%s\" is NaN\n", marker.c_str());
        return HMpsFF::Parsekey::kFail;
      }
      if (value) {
        parseName(marker);  // rowidx set and num_nz incremented
        if (rowidx >= 0) {
          if (col_value[rowidx]) {
            // Ignore duplicate entry
            num_nz--;
            num_ignored_duplicate_matrix_nz++;
            if (num_ignored_duplicate_matrix_nz %
                    report_ignored_duplicate_matrix_nz_frequency ==
                0) {
              highsLogUser(log_options, HighsLogType::kWarning,
                           "Column \"%s\" has duplicate nonzero %g in row "
                           "\"%s\": ignored\n",
                           colname.c_str(), value, marker.c_str());
              report_ignored_duplicate_matrix_nz_frequency *= 2;
            }
          } else {
            col_value[rowidx] = value;
            col_index[col_count++] = rowidx;
          }
        } else if (rowidx == -1) {
          // Ignore duplicate entry
          if (col_cost) {
            num_ignored_duplicate_cost_nz++;
            if (num_ignored_duplicate_cost_nz %
                    report_ignored_duplicate_cost_nz_frequency ==
                0) {
              highsLogUser(log_options, HighsLogType::kWarning,
                           "Column \"%s\" has duplicate nonzero %g in "
                           "objective row \"%s\": ignored\n",
                           colname.c_str(), value, objective_name.c_str());
              report_ignored_duplicate_cost_nz_frequency *= 2;
            }
          } else {
            col_cost = value;
          }
        }
      }
    }
  }

  return Parsekey::kFail;
}